

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

void jacobi(float (*aa) [2],int n,float *d,float (*v) [2],int *nrot)

{
  int iVar1;
  float *extraout_RDX;
  uint uVar2;
  undefined4 in_register_00000034;
  float *pfVar3;
  float *pfVar4;
  float *in_R9;
  float fVar5;
  float fVar7;
  double dVar6;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float *unaff_retaddr;
  float *in_stack_00000008;
  float *in_stack_00000010;
  
  pfVar3 = (float *)CONCAT44(in_register_00000034,n);
  if (n != 2) {
    pfVar4 = (float *)(ulong)(uint)n;
    jacobi_cold_1();
    fVar7 = (float)*(undefined8 *)(extraout_RDX + 2);
    fVar11 = (float)((ulong)*(undefined8 *)(extraout_RDX + 2) >> 0x20);
    fVar5 = (float)*(undefined8 *)extraout_RDX;
    fVar9 = (float)((ulong)*(undefined8 *)extraout_RDX >> 0x20);
    auVar8._0_8_ = (double)(fVar5 * fVar5 + fVar7 * fVar7);
    auVar8._8_8_ = (double)(fVar9 * fVar9 + fVar11 * fVar11);
    auVar8 = sqrtpd(auVar8,auVar8);
    dVar6 = acos((double)(fVar9 * fVar5 + fVar11 * fVar7) / (auVar8._8_8_ * auVar8._0_8_));
    *in_stack_00000010 = (float)((dVar6 * 180.0) / 3.141592653589793);
    fVar5 = *pfVar4 * *extraout_RDX + pfVar4[1] * extraout_RDX[2];
    *nrot = (int)fVar5;
    fVar9 = pfVar4[2] * *extraout_RDX + pfVar4[3] * extraout_RDX[2];
    ((float *)nrot)[1] = fVar9;
    fVar5 = fVar5 - *pfVar3 * *extraout_RDX;
    *nrot = (int)fVar5;
    fVar9 = fVar9 - *pfVar3 * extraout_RDX[2];
    ((float *)nrot)[1] = fVar9;
    *unaff_retaddr = SQRT(fVar5 * fVar5 + fVar9 * fVar9);
    fVar5 = *pfVar4 * extraout_RDX[1] + pfVar4[1] * extraout_RDX[3];
    *in_R9 = fVar5;
    fVar9 = pfVar4[2] * extraout_RDX[1] + pfVar4[3] * extraout_RDX[3];
    in_R9[1] = fVar9;
    fVar5 = fVar5 - pfVar3[1] * extraout_RDX[1];
    *in_R9 = fVar5;
    fVar9 = fVar9 - pfVar3[1] * extraout_RDX[3];
    in_R9[1] = fVar9;
    *in_stack_00000008 = SQRT(fVar5 * fVar5 + fVar9 * fVar9);
    return;
  }
  iVar1 = 0;
  *v = (float  [2])0x0;
  fVar5 = (*aa)[0];
  fVar9 = (*aa)[1];
  (*v)[0] = 1.0;
  v[1] = (float  [2])0x0;
  fVar7 = aa[1][1];
  v[1][1] = 1.0;
  *d = fVar5;
  d[1] = fVar7;
  *nrot = 0;
  uVar2 = 0;
  do {
    if ((fVar9 == 0.0) && (!NAN(fVar9))) {
      return;
    }
    fVar14 = ABS(fVar9);
    fVar11 = fVar14 * 0.2 * 0.25;
    if (2 < uVar2) {
      fVar11 = 0.0;
    }
    fVar15 = fVar14 * 100.0;
    if (uVar2 < 4) {
LAB_0010420c:
      fVar12 = 0.0;
      fVar10 = 0.0;
      if (fVar11 < fVar14) {
        fVar11 = d[1] - *d;
        fVar14 = ABS(fVar11);
        if ((fVar15 + fVar14 != fVar14) || (NAN(fVar15 + fVar14) || NAN(fVar14))) {
          fVar14 = (fVar11 * 0.5) / fVar9;
          fVar11 = 1.0 / (SQRT(fVar14 * fVar14 + 1.0) + ABS(fVar14));
          if (fVar14 < 0.0) {
            fVar11 = -fVar11;
          }
        }
        else {
          fVar11 = fVar9 / fVar11;
        }
        fVar14 = 1.0 / SQRT(fVar11 * fVar11 + 1.0);
        fVar9 = fVar9 * fVar11;
        fVar11 = fVar11 * fVar14;
        fVar16 = fVar11 / (fVar14 + 1.0);
        fVar12 = 0.0 - fVar9;
        fVar10 = fVar9 + 0.0;
        *d = *d - fVar9;
        d[1] = fVar9 + d[1];
        fVar9 = SUB84(*v,0);
        fVar15 = SUB84(*v,4);
        fVar14 = SUB84(v[1],0);
        fVar13 = SUB84(v[1],4);
        (*v)[0] = (fVar9 * fVar16 + fVar15) * -fVar11 + fVar9;
        (*v)[1] = (-fVar15 * fVar16 + fVar9) * fVar11 + fVar15;
        v[1][0] = (fVar14 * fVar16 + fVar13) * -fVar11 + fVar14;
        v[1][1] = (-fVar13 * fVar16 + fVar14) * fVar11 + fVar13;
        iVar1 = iVar1 + 1;
        *nrot = iVar1;
        fVar9 = 0.0;
      }
    }
    else {
      fVar10 = ABS(*d);
      if ((fVar15 + fVar10 != fVar10) || (NAN(fVar15 + fVar10) || NAN(fVar10))) goto LAB_0010420c;
      fVar10 = ABS(d[1]);
      if ((fVar15 + fVar10 != fVar10) || (NAN(fVar15 + fVar10) || NAN(fVar10))) goto LAB_0010420c;
      fVar9 = 0.0;
      fVar12 = 0.0;
      fVar10 = 0.0;
    }
    fVar5 = fVar5 + fVar12;
    fVar7 = fVar7 + fVar10;
    *d = fVar5;
    d[1] = fVar7;
    uVar2 = uVar2 + 1;
    if (uVar2 == 100) {
      return;
    }
  } while( true );
}

Assistant:

void jacobi(float aa[N][N], int n, float d[N], float v[N][N],
int *nrot)
{
int j,iq,ip,i;
float thresh,theta,tau,t,sm,s,h,g,c;
float b[N],z[N],a[N][N];

if(n!=N) {
    fprintf(stderr,"\nFatal error: n %d not N %d in jacobi\n",n,N);
    exit(EXIT_FAILURE);
    }
for(ip=0;ip<n;ip++) /* Initialize to the identity matrix */
	{
	for(iq=0;iq<n;iq++) v[ip][iq] = 0.0;
	for(iq=0;iq<n;iq++) a[ip][iq] = aa[ip][iq]; /* Don't destroy aa */
	v[ip][ip] = 1.0;
	}
/* Initialize b and d to the diagonals of a */
for(ip=0;ip<n;ip++)
	{
	b[ip] = d[ip] = a[ip][ip];
	z[ip] = 0.0;
	}
*nrot = 0;
for(i=0;i<100;i++)
	{
	sm = 0.0;
	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			sm += (float) fabs(a[ip][iq]);
		}

	/* Normal return, which relies on quadratic convergence to
	   machine underflow */
	if(sm == 0.0) return;

	if(i<3) thresh=(float) (0.2*sm/(n*n)); /* on the first three sweeps */
	else thresh = 0.0; /* the rest of the sweeps */

	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			{
			g = (float)(100.0*fabs(a[ip][iq]));
			/* After 4 sweeps skip the rotation if the
			   off diagonal element is small */
			if(i>3 && fabs(d[ip])+g == fabs(d[ip])
			       && fabs(d[iq])+g == fabs(d[iq])) a[ip][iq] = 0.0;
			else if(fabs(a[ip][iq]) > thresh)
				{
				h = d[iq]-d[ip];
				if(fabs(h)+g==fabs(h)) t=(a[ip][iq])/h;
				else
				  {
				  theta = 0.5f*h/(a[ip][iq]);
				  t = (float)(1.0/(fabs(theta)+sqrt(1.0+theta*theta)));
				  if(theta < 0.0) t = -t;
				  }
				c = (float)(1.0/sqrt(1.0+t*t));
				s = t*c;
				tau = s/(1.0f+c);
				h = t*a[ip][iq];
				z[ip] -= h;
				z[iq] += h;
				d[ip] -= h;
				d[iq] += h;
				a[ip][iq] = 0.0;
				for(j=0;j<ip-1;j++)
					rotate(a,j,ip,j,iq,&h,&g,s,tau);
				for(j=ip+1;j<iq-1;j++)
					rotate(a,ip,j,j,iq,&h,&g,s,tau);
				for(j=iq+1;j<n;j++)
					rotate(a,ip,j,iq,j,&h,&g,s,tau);
				for(j=0;j<n;j++)
					rotate(v,j,ip,j,iq,&h,&g,s,tau);
				++(*nrot);
				}
			}
		}
	for(ip=0;ip<n;ip++)
		{
		b[ip] += z[ip];
		d[ip] = b[ip];
		z[ip] = 0.0;
		}
	}
/* fprintf(stderr,"\nFatal error: too many iterations in jacobi\n"); */
}